

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocatorTest.cpp
# Opt level: O0

void __thiscall
TEST_TestMemoryAccountant_countAllocationsPerSizeMultipleAllocations_Test::testBody
          (TEST_TestMemoryAccountant_countAllocationsPerSizeMultipleAllocations_Test *this)

{
  UtestShell *pUVar1;
  size_t sVar2;
  TestTerminator *pTVar3;
  TEST_TestMemoryAccountant_countAllocationsPerSizeMultipleAllocations_Test *this_local;
  
  MemoryAccountant::alloc(&(this->super_TEST_GROUP_CppUTestGroupTestMemoryAccountant).accountant,4);
  MemoryAccountant::alloc(&(this->super_TEST_GROUP_CppUTestGroupTestMemoryAccountant).accountant,4);
  MemoryAccountant::alloc(&(this->super_TEST_GROUP_CppUTestGroupTestMemoryAccountant).accountant,8);
  pUVar1 = UtestShell::getCurrent();
  sVar2 = MemoryAccountant::totalAllocationsOfSize
                    (&(this->super_TEST_GROUP_CppUTestGroupTestMemoryAccountant).accountant,4);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[0xe])
            (pUVar1,2,sVar2,"LONGS_EQUAL(2, accountant.totalAllocationsOfSize(4)) failed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestMemoryAllocatorTest.cpp"
             ,0x182,pTVar3);
  pUVar1 = UtestShell::getCurrent();
  sVar2 = MemoryAccountant::totalAllocationsOfSize
                    (&(this->super_TEST_GROUP_CppUTestGroupTestMemoryAccountant).accountant,8);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[0xe])
            (pUVar1,1,sVar2,"LONGS_EQUAL(1, accountant.totalAllocationsOfSize(8)) failed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestMemoryAllocatorTest.cpp"
             ,0x183,pTVar3);
  pUVar1 = UtestShell::getCurrent();
  sVar2 = MemoryAccountant::totalAllocationsOfSize
                    (&(this->super_TEST_GROUP_CppUTestGroupTestMemoryAccountant).accountant,10);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[0xe])
            (pUVar1,0,sVar2,"LONGS_EQUAL(0, accountant.totalAllocationsOfSize(10)) failed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestMemoryAllocatorTest.cpp"
             ,0x184,pTVar3);
  pUVar1 = UtestShell::getCurrent();
  sVar2 = MemoryAccountant::totalAllocations
                    (&(this->super_TEST_GROUP_CppUTestGroupTestMemoryAccountant).accountant);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[0xe])
            (pUVar1,3,sVar2,"LONGS_EQUAL(3, accountant.totalAllocations()) failed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestMemoryAllocatorTest.cpp"
             ,0x185,pTVar3);
  return;
}

Assistant:

TEST(TestMemoryAccountant, countAllocationsPerSizeMultipleAllocations)
{
    accountant.alloc(4);
    accountant.alloc(4);
    accountant.alloc(8);
    LONGS_EQUAL(2, accountant.totalAllocationsOfSize(4));
    LONGS_EQUAL(1, accountant.totalAllocationsOfSize(8));
    LONGS_EQUAL(0, accountant.totalAllocationsOfSize(10));
    LONGS_EQUAL(3, accountant.totalAllocations());
}